

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O0

FILE * Io_FileOpen(char *FileName,char *PathVar,char *Mode,int fVerbose)

{
  char *pcVar1;
  FILE *pFVar2;
  FILE *fp;
  char ActualFileName [4096];
  char *i;
  char *c;
  char *t;
  int fVerbose_local;
  char *Mode_local;
  char *PathVar_local;
  char *FileName_local;
  
  if (PathVar == (char *)0x0) {
    FileName_local = (char *)fopen(FileName,Mode);
  }
  else {
    pcVar1 = Abc_FrameReadFlag(PathVar);
    if (pcVar1 == (char *)0x0) {
      FileName_local = (char *)fopen(FileName,Mode);
    }
    else {
      pcVar1 = Extra_UtilStrsav(pcVar1);
      ActualFileName._4088_8_ = strtok(pcVar1,":");
      while (ActualFileName._4088_8_ != 0) {
        snprintf((char *)&fp,0x1000,"%s/%s",ActualFileName._4088_8_,FileName);
        pFVar2 = fopen((char *)&fp,Mode);
        if (pFVar2 != (FILE *)0x0) {
          if (fVerbose != 0) {
            fprintf(_stdout,"Using file %s\n",&fp);
          }
          if (pcVar1 == (char *)0x0) {
            return (FILE *)pFVar2;
          }
          free(pcVar1);
          return (FILE *)pFVar2;
        }
        ActualFileName._4088_8_ = strtok((char *)0x0,":");
      }
      if (pcVar1 != (char *)0x0) {
        free(pcVar1);
      }
      FileName_local = (char *)0x0;
    }
  }
  return (FILE *)FileName_local;
}

Assistant:

FILE * Io_FileOpen( const char * FileName, const char * PathVar, const char * Mode, int fVerbose )
{
    char * t = 0, * c = 0, * i;

    if ( PathVar == 0 )
    {
        return fopen( FileName, Mode );
    }
    else
    {
        if ( (c = Abc_FrameReadFlag( (char*)PathVar )) )
        {
            char ActualFileName[4096];
            FILE * fp = 0;
            t = Extra_UtilStrsav( c );
            for (i = strtok( t, ":" ); i != 0; i = strtok( 0, ":") )
            {
#ifdef WIN32
                _snprintf ( ActualFileName, 4096, "%s/%s", i, FileName );
#else
                snprintf ( ActualFileName, 4096, "%s/%s", i, FileName );
#endif
                if ( ( fp = fopen ( ActualFileName, Mode ) ) )
                {
                    if ( fVerbose )
                    fprintf ( stdout, "Using file %s\n", ActualFileName );
                    ABC_FREE( t );
                    return fp;
                }
            }
            ABC_FREE( t );
            return 0;
        }
        else
        {
            return fopen( FileName, Mode );
        }
    }
}